

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O1

void __thiscall llbuild::buildsystem::BuildKey::BuildKey(BuildKey *this,char kindCode,StringRef str)

{
  string encodedKey;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long *local_50 [2];
  long local_40 [2];
  
  (this->key).key._M_dataplus._M_p = (pointer)&(this->key).key.field_2;
  (this->key).key._M_string_length = 0;
  (this->key).key.field_2._M_local_buf[0] = '\0';
  local_68 = 0;
  local_60 = 0;
  local_70 = &local_60;
  std::__cxx11::string::reserve((ulong)&local_70);
  std::__cxx11::string::push_back((char)&local_70);
  std::__cxx11::string::replace((ulong)&local_70,local_68,(char *)0x0,(ulong)str.Data);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,local_70,local_70 + local_68);
  std::__cxx11::string::operator=((string *)this,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return;
}

Assistant:

BuildKey(char kindCode, StringRef str) {
    std::string encodedKey;
    encodedKey.reserve(1 + str.size());
    encodedKey.push_back(kindCode);
    encodedKey.append(str.begin(), str.end());
    key = encodedKey;
  }